

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::ScalarReplacementPass::CopyNecessaryMemberDecorationsToVariable
          (ScalarReplacementPass *this,Instruction *from,Instruction *to,uint32_t member_index)

{
  initializer_list<unsigned_int> init_list;
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  Op OVar4;
  Instruction *pIVar5;
  DecorationManager *this_00;
  reference ppIVar6;
  Instruction *this_01;
  IRContext *pIVar7;
  pointer pIVar8;
  Operand *pOVar9;
  Operand local_130;
  uint local_100;
  uint32_t local_fc;
  uint32_t i;
  undefined8 local_f0;
  SmallVector<unsigned_int,_2UL> local_e8;
  Operand local_c0;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_90;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_78;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  new_dec_inst;
  uint32_t decoration;
  Instruction *dec_inst;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  Instruction *type_inst;
  uint32_t member_index_local;
  Instruction *to_local;
  Instruction *from_local;
  ScalarReplacementPass *this_local;
  
  pIVar5 = GetStorageType(this,from);
  this_00 = Pass::get_decoration_mgr((Pass *)this);
  uVar3 = opt::Instruction::result_id(pIVar5);
  analysis::DecorationManager::GetDecorationsFor
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &__begin2,this_00,uVar3,false);
  __end2 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ::begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)&__begin2);
  dec_inst = (Instruction *)
             std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)&__begin2);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                     *)&dec_inst), bVar2) {
    ppIVar6 = __gnu_cxx::
              __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
              ::operator*(&__end2);
    pIVar5 = *ppIVar6;
    OVar4 = opt::Instruction::opcode(pIVar5);
    if (((OVar4 == OpMemberDecorate) &&
        (uVar3 = opt::Instruction::GetSingleWordInOperand(pIVar5,1), uVar3 == member_index)) &&
       ((new_dec_inst._M_t.
         super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
         .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ =
              opt::Instruction::GetSingleWordInOperand(pIVar5,2),
        new_dec_inst._M_t.
        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ == 0 ||
        ((new_dec_inst._M_t.
          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ == 6 ||
         (new_dec_inst._M_t.
          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ - 0x2c < 4)
         ))))) {
      this_01 = (Instruction *)::operator_new(0x70);
      pIVar7 = Pass::context((Pass *)this);
      memset(&local_90,0,0x18);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                (&local_90);
      opt::Instruction::Instruction(this_01,pIVar7,OpDecorate,0,0,&local_90);
      std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
      unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
                ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                  *)&local_78,this_01);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                (&local_90);
      pIVar8 = std::
               unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ::operator->(&local_78);
      local_fc = opt::Instruction::result_id(to);
      _i = &local_fc;
      local_f0 = 1;
      init_list._M_len = 1;
      init_list._M_array = _i;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_e8,init_list);
      Operand::Operand(&local_c0,SPV_OPERAND_TYPE_ID,&local_e8);
      opt::Instruction::AddOperand(pIVar8,&local_c0);
      Operand::~Operand(&local_c0);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_e8);
      for (local_100 = 2; uVar1 = local_100, uVar3 = opt::Instruction::NumInOperandWords(pIVar5),
          uVar1 < uVar3; local_100 = local_100 + 1) {
        pIVar8 = std::
                 unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ::operator->(&local_78);
        pOVar9 = opt::Instruction::GetInOperand(pIVar5,local_100);
        Operand::Operand(&local_130,pOVar9);
        opt::Instruction::AddOperand(pIVar8,&local_130);
        Operand::~Operand(&local_130);
      }
      pIVar7 = Pass::context((Pass *)this);
      IRContext::AddAnnotationInst(pIVar7,&local_78);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::~unique_ptr(&local_78);
    }
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
    ::operator++(&__end2);
  }
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::~vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &__begin2);
  return;
}

Assistant:

void ScalarReplacementPass::CopyNecessaryMemberDecorationsToVariable(
    Instruction* from, Instruction* to, uint32_t member_index) {
  Instruction* type_inst = GetStorageType(from);
  for (auto dec_inst :
       get_decoration_mgr()->GetDecorationsFor(type_inst->result_id(), false)) {
    uint32_t decoration;
    if (dec_inst->opcode() == spv::Op::OpMemberDecorate) {
      if (dec_inst->GetSingleWordInOperand(1) != member_index) {
        continue;
      }

      decoration = dec_inst->GetSingleWordInOperand(2u);
      switch (spv::Decoration(decoration)) {
        case spv::Decoration::ArrayStride:
        case spv::Decoration::Alignment:
        case spv::Decoration::AlignmentId:
        case spv::Decoration::MaxByteOffset:
        case spv::Decoration::MaxByteOffsetId:
        case spv::Decoration::RelaxedPrecision: {
          std::unique_ptr<Instruction> new_dec_inst(
              new Instruction(context(), spv::Op::OpDecorate, 0, 0, {}));
          new_dec_inst->AddOperand(
              Operand(SPV_OPERAND_TYPE_ID, {to->result_id()}));
          for (uint32_t i = 2; i < dec_inst->NumInOperandWords(); ++i) {
            new_dec_inst->AddOperand(Operand(dec_inst->GetInOperand(i)));
          }
          context()->AddAnnotationInst(std::move(new_dec_inst));
        } break;
        default:
          break;
      }
    }
  }
}